

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformLocationTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::getFirstComponentName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,VarType *type)

{
  TypeComponentVector *this_00;
  uint uVar1;
  ostringstream buff;
  VarTypeComponent local_1d8;
  SubTypeAccess local_1d0;
  TypeAccessFormat local_1a0;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  uVar1 = *(uint *)(this + 8);
  if ((((ulong)uVar1 < 0x23) && ((0x77003801cU >> ((ulong)uVar1 & 0x3f) & 1) != 0)) ||
     (uVar1 - 0x24 < 3)) {
    glu::SubTypeAccess::SubTypeAccess(&local_1d0,(VarType *)this);
    local_1d8.type = VECTOR_COMPONENT;
    local_1d8.index = 0;
    std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
    emplace_back<glu::VarTypeComponent>(&local_1d0.m_path,&local_1d8);
    local_1a0.type = (VarType *)this;
    local_1a0.path = &local_1d0.m_path;
    glu::operator<<((ostream *)local_190,&local_1a0);
  }
  else {
    if (8 < uVar1 - 5 && 8 < uVar1 - 0x12) goto LAB_00500577;
    glu::SubTypeAccess::SubTypeAccess(&local_1d0,(VarType *)this);
    this_00 = &local_1d0.m_path;
    local_1d8.type = MATRIX_COLUMN;
    local_1d8.index = 0;
    std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
    emplace_back<glu::VarTypeComponent>(this_00,&local_1d8);
    local_1d8.type = VECTOR_COMPONENT;
    local_1d8.index = 0;
    std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
    emplace_back<glu::VarTypeComponent>(this_00,&local_1d8);
    local_1a0.type = (VarType *)this;
    local_1a0.path = this_00;
    glu::operator<<((ostream *)local_190,&local_1a0);
  }
  if (local_1d0.m_path.
      super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d0.m_path.
                    super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d0.m_path.
                          super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.m_path.
                          super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  glu::VarType::~VarType(&local_1d0.m_type);
LAB_00500577:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

string getFirstComponentName (const glu::VarType& type)
{
	std::ostringstream buff;
	if (glu::isDataTypeVector(type.getBasicType()))
		buff << glu::TypeAccessFormat(type, glu::SubTypeAccess(type).component(0).getPath());
	else if (glu::isDataTypeMatrix(type.getBasicType()))
		buff << glu::TypeAccessFormat(type, glu::SubTypeAccess(type).column(0).component(0).getPath());

	return buff.str();
}